

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void dec_build_inter_predictors
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,int plane,MB_MODE_INFO *mi,int build_for_obmc
               ,int bw,int bh,int mi_x,int mi_y)

{
  undefined8 in_RCX;
  undefined4 in_EDX;
  AV1_COMMON *unaff_RBX;
  undefined8 in_RSI;
  MACROBLOCKD *in_RDI;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_ffffffffffffffe0;
  
  build_inter_predictors
            (unaff_RBX,in_RDI,(int)((ulong)in_RSI >> 0x20),
             (MB_MODE_INFO *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),(int)((ulong)in_RCX >> 0x20)
             ,(int)in_RCX,in_stack_00000010,in_stack_00000018,in_stack_00000020,
             (uint8_t **)CONCAT44(build_for_obmc,bw));
  return;
}

Assistant:

static void dec_build_inter_predictors(const AV1_COMMON *cm,
                                       DecoderCodingBlock *dcb, int plane,
                                       const MB_MODE_INFO *mi,
                                       int build_for_obmc, int bw, int bh,
                                       int mi_x, int mi_y) {
  build_inter_predictors(cm, &dcb->xd, plane, mi, build_for_obmc, bw, bh, mi_x,
                         mi_y, dcb->mc_buf);
}